

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_appendCString_success_nullptrArray_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  char **ppcVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator = private_ACUtilsTest_AString_realloc;
  string.deallocator = private_ACUtilsTest_AString_free;
  string.buffer = (char *)0x0;
  string.size = 5;
  string.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x12b8ca;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"01234",6);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x12b905;
  bVar1 = AString_appendCString(&string,(char *)0x0,4);
  if (bVar1 == false) {
    uStack_50 = 0x12b9fe;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x3df,"Assertion \'AString_appendCString(&string, ((void*)0), 4)\' failed",0,
                      0);
  }
  uStack_50 = 0x12b91e;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x3df);
  if (string.capacity == 8) {
    uStack_50 = 0x12b93e;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x3e0);
    if (string.buffer == (char *)0x0) {
      ppcVar7 = &local_58;
      pcVar5 = "Assertion \'_ck_x != NULL\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
      pcVar8 = "(void*) (string).buffer != NULL";
      pcVar9 = "(void*) (string).buffer";
      iVar2 = 0x3e0;
LAB_0012bb57:
      uStack_50 = 0;
      local_58 = (char *)0x0;
      *(code **)((long)ppcVar7 + -8) = test_AString_appendCString_success_zeroArraySize_fn;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,iVar2,pcVar5,pcVar4,pcVar8,pcVar9);
    }
    uStack_50 = 0x12b95b;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x3e0);
    pcVar9 = string.buffer;
    if (string.buffer == (char *)0x0) {
      pcVar4 = "";
      pcVar9 = "(null)";
    }
    else {
      uStack_50 = 0x12b978;
      iVar2 = strcmp("01234",string.buffer);
      if (iVar2 == 0) {
        uStack_50 = 0x12b991;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x3e0);
        if (string.size == 5) {
          uStack_50 = 0x12b9b1;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x3e0);
          if (private_ACUtilsTest_AString_reallocCount == 0) {
            uStack_50 = 0x12b9d2;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x3e1);
            uStack_50 = 0x12b9db;
            (*string.deallocator)(string.buffer);
            return;
          }
          ppcVar7 = &local_68;
          local_60 = "(0)";
          local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
          pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
          pcVar9 = "private_ACUtilsTest_AString_reallocCount";
          iVar2 = 0x3e1;
          goto LAB_0012bb57;
        }
        local_60 = "strlen(\"01234\")";
        pcVar5 = "(string).size == strlen(\"01234\")";
        pcVar8 = "(string).size";
        local_58 = (char *)0x5;
        pcVar4 = (char *)string.size;
        goto LAB_0012bb0a;
      }
      pcVar4 = "\"";
    }
    expr = 
    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
    ;
    pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
    pcVar5 = "(string).buffer == (\"01234\")";
    pcVar8 = "(string).buffer";
    local_58 = "\"";
    local_60 = "01234";
    local_68 = "\"";
    pcStack_70 = "(\"01234\")";
    ppcVar6 = &pcStack_80;
    pcStack_80 = pcVar9;
    pcStack_78 = pcVar4;
  }
  else {
    local_60 = "(8)";
    pcVar5 = "(string).capacity == (8)";
    pcVar8 = "(string).capacity";
    local_58 = (char *)0x8;
    pcVar4 = (char *)string.capacity;
LAB_0012bb0a:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar6 = &local_60;
  }
  uStack_50 = 0;
  *(char **)((long)ppcVar6 + -8) = pcVar4;
  *(undefined8 *)((long)ppcVar6 + -0x10) = 0x12bb13;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x3e0,expr,pcVar3,pcVar5,pcVar8);
}

Assistant:

END_TEST
START_TEST(test_AString_appendCString_success_nullptrArray)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("01234", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_appendCString(&string, nullptr, 4));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "01234", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string);
}